

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_Parser.cpp
# Opt level: O3

void __thiscall
psy::C::Parser::DiagnosticsReporter::ExpectedFollowOfStructDeclarator(DiagnosticsReporter *this)

{
  long *plVar1;
  SyntaxToken *this_00;
  _Hash_node_base *p_Var2;
  long *plVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *validTkKinds;
  initializer_list<psy::C::SyntaxKind> __l;
  string s;
  allocator_type local_199;
  long *local_198;
  long local_190;
  long local_188;
  long lStack_180;
  long *local_178;
  long local_170;
  long local_168;
  long lStack_160;
  undefined1 local_158 [40];
  _Hash_node_base local_130;
  size_t sStack_128;
  __node_base *local_120 [2];
  __node_base local_110 [2];
  pointer local_100 [2];
  undefined1 local_f0 [16];
  _Alloc_hider local_e0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  string local_c0;
  SyntaxKind local_9e [3];
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  local_9e[0] = CommaToken;
  local_9e[1] = SemicolonToken;
  local_9e[2] = 0x57;
  __l._M_len = 3;
  __l._M_array = local_9e;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            ((vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)local_158,__l,
             &local_199);
  joinTokenNames_abi_cxx11_(&local_c0,(DiagnosticsReporter *)local_158,validTkKinds);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,0x45a4f6);
  p_Var2 = (_Hash_node_base *)(plVar1 + 2);
  if ((_Hash_node_base *)*plVar1 == p_Var2) {
    local_130._M_nxt = p_Var2->_M_nxt;
    sStack_128 = plVar1[3];
    local_158._24_8_ = &local_130;
  }
  else {
    local_130._M_nxt = p_Var2->_M_nxt;
    local_158._24_8_ = (_Hash_node_base *)*plVar1;
  }
  local_158._32_8_ = plVar1[1];
  *plVar1 = (long)p_Var2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append(local_158 + 0x18);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_168 = *plVar3;
    lStack_160 = plVar1[3];
    local_178 = &local_168;
  }
  else {
    local_168 = *plVar3;
    local_178 = (long *)*plVar1;
  }
  local_170 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  this_00 = peek(this->parser_,1);
  SyntaxToken::valueText_c_str(this_00);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_178);
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 == paVar4) {
    local_88._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_88._8_8_ = plVar1[3];
    local_98._0_8_ = &local_88;
  }
  else {
    local_88._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_98._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar1;
  }
  local_98._8_8_ = plVar1[1];
  *plVar1 = (long)paVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append(local_98);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_188 = *plVar3;
    lStack_180 = plVar1[3];
    local_198 = &local_188;
  }
  else {
    local_188 = *plVar3;
    local_198 = (long *)*plVar1;
  }
  local_190 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._0_8_ != &local_88) {
    operator_delete((void *)local_98._0_8_,local_88._0_8_ + 1);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,local_168 + 1);
  }
  if ((_Hash_node_base *)local_158._24_8_ != &local_130) {
    operator_delete((void *)local_158._24_8_,(ulong)((long)&(local_130._M_nxt)->_M_nxt + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((Parser *)local_158._0_8_ != (Parser *)0x0) {
    operator_delete((void *)local_158._0_8_,local_158._16_8_ - local_158._0_8_);
  }
  local_e0[0]._M_p = (pointer)&local_d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_e0,ID_of_ExpectedFollowOfStructDeclarator_abi_cxx11_._M_dataplus._M_p,
             ID_of_ExpectedFollowOfStructDeclarator_abi_cxx11_._M_dataplus._M_p +
             ID_of_ExpectedFollowOfStructDeclarator_abi_cxx11_._M_string_length);
  local_100[0] = (pointer)local_f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_100,"[[unexpected Follow of field declarator]]","");
  local_120[0] = local_110;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,local_198,local_190 + (long)local_198);
  psy::DiagnosticDescriptor::DiagnosticDescriptor
            ((DiagnosticDescriptor *)local_98,local_e0,local_100,local_120,2,1);
  diagnoseOrDelayDiagnostic(this,(DiagnosticDescriptor *)local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._0_8_ != &local_88) {
    operator_delete((void *)local_98._0_8_,local_88._0_8_ + 1);
  }
  if (local_120[0] != local_110) {
    operator_delete(local_120[0],
                    (ulong)((long)&(((DiagnosticDescriptor *)&(local_110[0]._M_nxt)->_M_nxt)->id_).
                                   _M_dataplus._M_p + 1));
  }
  if (local_100[0] != (pointer)local_f0) {
    operator_delete(local_100[0],
                    (ulong)((long)&(((_Tuple_impl<0UL,_psy::DiagnosticDescriptor,_unsigned_long,_const_psy::C::SyntaxNode_*>
                                      *)local_f0._0_8_)->
                                   super__Tuple_impl<1UL,_unsigned_long,_const_psy::C::SyntaxNode_*>
                                   ).super__Tuple_impl<2UL,_const_psy::C::SyntaxNode_*>.
                                   super__Head_base<2UL,_const_psy::C::SyntaxNode_*,_false>.
                                   _M_head_impl + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0[0]._M_p != &local_d0) {
    operator_delete(local_e0[0]._M_p,local_d0._M_allocated_capacity + 1);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198,local_188 + 1);
  }
  return;
}

Assistant:

void Parser::DiagnosticsReporter::ExpectedFollowOfStructDeclarator()
{
    auto validTkKinds = { SyntaxKind::CommaToken,
                          SyntaxKind::SemicolonToken,
                          SyntaxKind::ColonToken };

    std::string s = "expected "
            + joinTokenNames(validTkKinds)
            + "after field declarator, got `"
            + parser_->peek().valueText_c_str()
            + "'";

    diagnoseOrDelayDiagnostic(
                DiagnosticDescriptor(ID_of_ExpectedFollowOfStructDeclarator,
                                     "[[unexpected Follow of field declarator]]",
                                     s,
                                     DiagnosticSeverity::Error,
                                     DiagnosticCategory::Syntax));
}